

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_time_impl.h
# Opt level: O0

uchar mbedtls_ct_uchar_in_range_if(uchar low,uchar high,uchar c,uchar t)

{
  mbedtls_ct_uint_t mVar1;
  mbedtls_ct_uint_t mVar2;
  uint high_mask;
  uint low_mask;
  uchar to;
  uchar co;
  uchar t_local;
  uchar c_local;
  uchar high_local;
  uchar low_local;
  
  mVar1 = mbedtls_ct_compiler_opaque((ulong)c);
  mVar2 = mbedtls_ct_compiler_opaque((ulong)t);
  return (((byte)((uint)(byte)mVar1 - (uint)low >> 8) | (byte)((uint)high - (uint)(byte)mVar1 >> 8))
         ^ 0xff) & (byte)mVar2;
}

Assistant:

static inline unsigned char mbedtls_ct_uchar_in_range_if(unsigned char low,
                                                         unsigned char high,
                                                         unsigned char c,
                                                         unsigned char t)
{
    const unsigned char co = (unsigned char) mbedtls_ct_compiler_opaque(c);
    const unsigned char to = (unsigned char) mbedtls_ct_compiler_opaque(t);

    /* low_mask is: 0 if low <= c, 0x...ff if low > c */
    unsigned low_mask = ((unsigned) co - low) >> 8;
    /* high_mask is: 0 if c <= high, 0x...ff if c > high */
    unsigned high_mask = ((unsigned) high - co) >> 8;

    return (unsigned char) (~(low_mask | high_mask)) & to;
}